

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row)

{
  SelectionMode SVar1;
  QListWidgetPrivate *this_00;
  QListModel *pQVar2;
  QItemSelectionModel *pQVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = QListWidgetPrivate::listModel(this_00);
  (**(code **)(*(long *)pQVar2 + 0x60))(&local_48,pQVar2,row,0);
  SVar1 = (this_00->super_QListViewPrivate).super_QAbstractItemViewPrivate.selectionMode;
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  uVar5 = 0x12;
  if (SVar1 == NoSelection) {
    uVar5 = 0;
  }
  uVar4 = 3;
  if (SVar1 != SingleSelection) {
    uVar4 = uVar5;
  }
  (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_48,uVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setCurrentRow(int row)
{
    Q_D(QListWidget);
    QModelIndex index = d->listModel()->index(row);
    if (d->selectionMode == SingleSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::ClearAndSelect);
    else if (d->selectionMode == NoSelection)
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
    else
        selectionModel()->setCurrentIndex(index, QItemSelectionModel::SelectCurrent);
}